

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsCore.c
# Opt level: O3

int Abc_WinNode(Mfs_Man_t *p,Abc_Obj_t *pNode)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Aig_Man_t *p_00;
  Cnf_Dat_t *pCVar3;
  sat_solver *psVar4;
  int iVar5;
  
  p->nNodesTried = p->nNodesTried + 1;
  Mfs_ManClean(p);
  pVVar2 = Abc_MfsComputeRoots(pNode,p->pPars->nWinTfoLevs,p->pPars->nFanoutsMax);
  p->vRoots = pVVar2;
  pVVar2 = Abc_NtkNodeSupport(p->pNtk,(Abc_Obj_t **)pVVar2->pArray,pVVar2->nSize);
  p->vSupp = pVVar2;
  pVVar2 = Abc_NtkDfsNodes(p->pNtk,(Abc_Obj_t **)p->vRoots->pArray,p->vRoots->nSize);
  p->vNodes = pVVar2;
  iVar1 = p->pPars->nWinMax;
  if ((iVar1 == 0) || (iVar5 = 1, pVVar2->nSize <= iVar1)) {
    iVar1 = Abc_ObjRequiredLevel(pNode);
    pVVar2 = Abc_MfsComputeDivisors(p,pNode,iVar1 + -1);
    p->vDivs = pVVar2;
    p->nTotalDivs = p->nTotalDivs + (pVVar2->nSize - (pNode->vFanins).nSize);
    p_00 = Abc_NtkConstructAig(p,pNode);
    p->pAigWin = p_00;
    pCVar3 = Cnf_DeriveSimple(p_00,p->vDivs->nSize + 1);
    p->pCnf = pCVar3;
    iVar5 = 0;
    psVar4 = Abc_MfsCreateSolverResub(p,(int *)0x0,0,0);
    p->pSat = psVar4;
    if (psVar4 == (sat_solver *)0x0) {
      p->nNodesBad = p->nNodesBad + 1;
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

int Abc_WinNode(Mfs_Man_t * p, Abc_Obj_t *pNode)
{
//    abctime clk;
//    Abc_Obj_t * pFanin;
//    int i;

    p->nNodesTried++;
    // prepare data structure for this node
    Mfs_ManClean( p );
    // compute window roots, window support, and window nodes
    p->vRoots = Abc_MfsComputeRoots( pNode, p->pPars->nWinTfoLevs, p->pPars->nFanoutsMax );
    p->vSupp  = Abc_NtkNodeSupport( p->pNtk, (Abc_Obj_t **)Vec_PtrArray(p->vRoots), Vec_PtrSize(p->vRoots) );
    p->vNodes = Abc_NtkDfsNodes( p->pNtk, (Abc_Obj_t **)Vec_PtrArray(p->vRoots), Vec_PtrSize(p->vRoots) );
    if ( p->pPars->nWinMax && Vec_PtrSize(p->vNodes) > p->pPars->nWinMax )
        return 1;
    // compute the divisors of the window
    p->vDivs  = Abc_MfsComputeDivisors( p, pNode, Abc_ObjRequiredLevel(pNode) - 1 );
    p->nTotalDivs += Vec_PtrSize(p->vDivs) - Abc_ObjFaninNum(pNode);
    // construct AIG for the window
    p->pAigWin = Abc_NtkConstructAig( p, pNode );
    // translate it into CNF
    p->pCnf = Cnf_DeriveSimple( p->pAigWin, 1 + Vec_PtrSize(p->vDivs) );
    // create the SAT problem
    p->pSat = Abc_MfsCreateSolverResub( p, NULL, 0, 0 );
    if ( p->pSat == NULL )
    {
        p->nNodesBad++;
        return 1;
    }
	return 0;
}